

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void __thiscall mir::inst::LoadInst::display(LoadInst *this,ostream *o)

{
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::__ostream_insert<char,std::char_traits<char>>(o," = load ",8);
  (**(this->src).super_Displayable._vptr_Displayable)(&this->src,o);
  return;
}

Assistant:

void LoadInst::display(std::ostream& o) const {
  o << dest << " = load " << src;
}